

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fltstrip.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool_t bVar1;
  int iVar2;
  bfile_t *pbVar3;
  prf_model_t *model;
  prf_nodeinfo_t *ppVar4;
  char *pcVar5;
  char *__format;
  ulong uVar6;
  
  if (argc < 4) {
    pcVar5 = *argv;
    __format = "Usage: %s <inputfile> <outputfile> <opcode> [<opcode> ...]\n";
  }
  else {
    pbVar3 = bf_create_r(argv[1]);
    if (pbVar3 != (bfile_t *)0x0) {
      prf_init();
      model = prf_model_create();
      prf_model_poolmem(model);
      bVar1 = prf_model_load(model,pbVar3);
      if (bVar1 == 0) {
        puts("Error: Couldn\'t parse model.");
        bf_destroy(pbVar3);
      }
      else {
        bf_destroy(pbVar3);
        for (uVar6 = 3; (uint)argc != uVar6; uVar6 = uVar6 + 1) {
          iVar2 = atoi(argv[uVar6]);
          ppVar4 = prf_nodeinfo_get((uint16_t)iVar2);
          if (ppVar4 == (prf_nodeinfo_t *)0x0) {
            fprintf(_stderr,"Warning: couldn\'t find nodeinfo for \'%s\'\n",argv[uVar6]);
          }
          else {
            ppVar4->save_f = dont_save;
          }
        }
        pbVar3 = bf_create_w(argv[2]);
        if (pbVar3 != (bfile_t *)0x0) {
          prf_model_save(model,pbVar3);
          bf_destroy(pbVar3);
          prf_model_destroy(model);
          prf_exit();
          return 0;
        }
        printf("Error: Could not open \'%s\' for writing.\n",argv[2]);
        prf_model_destroy(model);
      }
      prf_exit();
      return -1;
    }
    pcVar5 = argv[1];
    __format = "Error: Could not open \'%s\' for loading.\n";
  }
  printf(__format,pcVar5);
  return -1;
}

Assistant:

int main(int argc, char ** argv )
{
  prf_model_t * model;
  bfile_t * bfile;
  int i;

  if ( argc <= 3 ) {
    printf( "Usage: %s <inputfile> <outputfile> <opcode> [<opcode> ...]\n",
      argv[0] );
    return -1;
  }

  bfile = bf_create_r( argv[1] );
  if ( ! bfile ) {
    printf( "Error: Could not open '%s' for loading.\n", argv[1] );
    return -1;
  }

  prf_init();

  model = prf_model_create();
  assert( model != NULL );
  prf_model_poolmem( model );

  if ( ! prf_model_load( model, bfile ) ) {
    printf( "Error: Couldn't parse model.\n" );
    bf_destroy( bfile );
    prf_exit();
    return -1;
  }
  bf_destroy( bfile );

  for ( i = 3; i < argc; i++ ) {
    prf_nodeinfo_t * info;
    info = prf_nodeinfo_get( atoi( argv[i] ) );
    if ( ! info ) {
      fprintf( stderr, "Warning: couldn't find nodeinfo for '%s'\n",
        argv[i] );
    } else {
      info->save_f = dont_save;
    }
  }

  bfile = bf_create_w( argv[2] );
  if ( ! bfile ) {
    printf( "Error: Could not open '%s' for writing.\n", argv[2] );
    prf_model_destroy( model );
    prf_exit();
    return -1;
  }
  prf_model_save( model, bfile );

  bf_destroy( bfile );
  prf_model_destroy( model );

  prf_exit();

  return 0;
}